

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<unsigned_int,short>(void)

{
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_02;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_03;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_04;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_05;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_06;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_07;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_00;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_01;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_02;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_03;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> lhs_04;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_08;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_09;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_10;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_11;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_12;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs_13;
  short u2;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  uint t;
  short u;
  undefined4 in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  short in_stack_fffffffffffffe5e;
  undefined2 in_stack_fffffffffffffe60;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe62;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe64;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe66;
  undefined4 in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe6c;
  short in_stack_fffffffffffffe6e;
  undefined2 in_stack_fffffffffffffe70;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe72;
  undefined2 in_stack_fffffffffffffe74;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffe76;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> local_12 [4];
  byte local_9;
  uint local_8;
  short local_2;
  
  local_2 = 0;
  local_8 = 0;
  local_9 = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,(short *)CONCAT26(in_stack_fffffffffffffe5e,
                                CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(local_12,&local_2);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
              CONCAT26(in_stack_fffffffffffffe6e,
                       CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  local_9 = (local_9 ^ 0xff) & 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(uint *)CONCAT26(in_stack_fffffffffffffe6e,
                               CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(short *)CONCAT26(in_stack_fffffffffffffe6e,
                                CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
              CONCAT26(in_stack_fffffffffffffe5e,
                       CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)));
  SafeInt::operator_cast_to_short
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
            );
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_08.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_08.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_08);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator*(in_stack_fffffffffffffe5e,rhs);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
             in_stack_fffffffffffffe66);
  local_2 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  rhs_09.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_09.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_09);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  local_2 = 1;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_10.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_10.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_10);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_11.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_11.m_int._0_2_ = in_stack_fffffffffffffe70;
  operator/(in_stack_fffffffffffffe6e,rhs_11);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_12.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_12.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_12);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_00.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_00.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator+(in_stack_fffffffffffffe5e,rhs_00);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  local_2 = 0;
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_13.m_int._2_2_ = in_stack_fffffffffffffe72.m_int;
  rhs_13.m_int._0_2_ = in_stack_fffffffffffffe70;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),rhs_13);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  rhs_01.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_01.m_int._0_2_ = in_stack_fffffffffffffe60;
  operator-(in_stack_fffffffffffffe5e,rhs_01);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  local_2 = 1;
  SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe76.m_int,
                      CONCAT24(in_stack_fffffffffffffe74,
                               CONCAT22(in_stack_fffffffffffffe72.m_int,in_stack_fffffffffffffe70)))
             ,(int *)CONCAT26(in_stack_fffffffffffffe6e,
                              CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe66.m_int);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe72);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator<<(CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c),in_stack_fffffffffffffe62
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
             in_stack_fffffffffffffe66);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe66.m_int);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe72);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator>>(CONCAT22(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe5c),in_stack_fffffffffffffe62
            );
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),
             in_stack_fffffffffffffe66);
  rhs_02.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_02.m_int._0_2_ = in_stack_fffffffffffffe60;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_02);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator&(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64.m_int,
                                         CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                  in_stack_fffffffffffffe60))));
  rhs_05.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_05.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_05);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  rhs_03.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_03.m_int._0_2_ = in_stack_fffffffffffffe60;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_03);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator|(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64.m_int,
                                         CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                  in_stack_fffffffffffffe60))));
  rhs_06.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_06.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_06);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  rhs_04.m_int._2_2_ = in_stack_fffffffffffffe62.m_int;
  rhs_04.m_int._0_2_ = in_stack_fffffffffffffe60;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_04);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),0);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)CONCAT26(in_stack_fffffffffffffe66.m_int,
                                   CONCAT24(in_stack_fffffffffffffe64.m_int,
                                            CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                     in_stack_fffffffffffffe60))));
  operator^(CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60),
            in_stack_fffffffffffffe64);
  local_8 = SafeInt::operator_cast_to_unsigned_int
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_fffffffffffffe66.m_int,
                                CONCAT24(in_stack_fffffffffffffe64.m_int,
                                         CONCAT22(in_stack_fffffffffffffe62.m_int,
                                                  in_stack_fffffffffffffe60))));
  rhs_07.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  rhs_07.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe5e,
                      CONCAT24(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58)),rhs_07);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe66.m_int,
                      CONCAT24(in_stack_fffffffffffffe64.m_int,
                               CONCAT22(in_stack_fffffffffffffe62.m_int,in_stack_fffffffffffffe60)))
             ,in_stack_fffffffffffffe5e);
  SafeInt<unsigned_int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT26(in_stack_fffffffffffffe6e,
                      CONCAT24(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
             in_stack_fffffffffffffe76);
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x19
                     );
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,0x19);
  local_9 = operator<(0x19,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  local_9 = operator<((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x19
                     );
  lhs.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(lhs,in_stack_fffffffffffffe62);
  local_9 = operator<=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,0x19);
  local_9 = operator<=(0x19,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  lhs_00.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_00.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator<=(lhs_00,in_stack_fffffffffffffe62);
  lhs_01.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_01.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(lhs_01,in_stack_fffffffffffffe62);
  local_9 = operator>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                      0x0,0x19);
  local_9 = operator>(0x19,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                            )0x0);
  lhs_02.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_02.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator>(lhs_02,in_stack_fffffffffffffe62);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                           0x19);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,0x19);
  local_9 = operator>=(0x19,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  local_9 = operator>=((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                           0x19);
  lhs_03.m_int._2_2_ = in_stack_fffffffffffffe66.m_int;
  lhs_03.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  local_9 = operator==(lhs_03,in_stack_fffffffffffffe62);
  local_9 = operator==((SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       0x0,0x19);
  local_9 = operator==(0x19,(SafeInt<unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter>
                             )0x0);
  lhs_04.m_int._2_2_ = local_12[0].m_int;
  lhs_04.m_int._0_2_ = in_stack_fffffffffffffe64.m_int;
  operator==(lhs_04,in_stack_fffffffffffffe62);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}